

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeExplain(Parse *pParse,u8 bPush,char *zFmt,...)

{
  undefined4 uVar1;
  char in_AL;
  int in_ECX;
  char in_SIL;
  long in_RDI;
  __va_list_tag *in_XMM2_Qb;
  char *in_XMM3_Qa;
  sqlite3 *in_XMM3_Qb;
  int iThis;
  va_list ap;
  Vdbe *v;
  char *zMsg;
  undefined4 in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Vdbe *in_stack_ffffffffffffff00;
  __va_list_tag *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  sqlite3 *in_stack_ffffffffffffff60;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff50 = in_XMM2_Qb;
    in_stack_ffffffffffffff58 = in_XMM3_Qa;
    in_stack_ffffffffffffff60 = in_XMM3_Qb;
  }
  if (*(char *)(in_RDI + 0x10b) == '\x02') {
    sqlite3VMPrintf(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    uVar1 = *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0xb8);
    sqlite3VdbeAddOp4(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                      in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                      (char *)CONCAT44(in_stack_fffffffffffffeec,0xfffffff9),in_ECX);
    if (in_SIL != '\0') {
      *(undefined4 *)(in_RDI + 0x118) = uVar1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeExplain(Parse *pParse, u8 bPush, const char *zFmt, ...){
  if( pParse->explain==2 ){
    char *zMsg;
    Vdbe *v;
    va_list ap;
    int iThis;
    va_start(ap, zFmt);
    zMsg = sqlite3VMPrintf(pParse->db, zFmt, ap);
    va_end(ap);
    v = pParse->pVdbe;
    iThis = v->nOp;
    sqlite3VdbeAddOp4(v, OP_Explain, iThis, pParse->addrExplain, 0,
                      zMsg, P4_DYNAMIC);
    if( bPush) pParse->addrExplain = iThis;
  }
}